

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.h
# Opt level: O2

Expression * __thiscall wasm::DataFlow::Graph::makeUse(Graph *this,Node *node)

{
  Module *pMVar1;
  Call *pCVar2;
  Expression *pEVar3;
  Const *pCVar4;
  LocalSet *pLVar5;
  Type TVar6;
  LocalGet *pLVar7;
  Index index;
  Literal local_68;
  Builder local_50;
  _Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> local_48;
  Builder local_28;
  Builder builder;
  
  pMVar1 = this->module;
  local_28.wasm = pMVar1;
  switch(node->type) {
  case Var:
    local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_50.wasm = pMVar1;
    pCVar2 = Builder::makeCall(&local_50,(Name)(this->FAKE_CALL).super_IString.str,
                               (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                               &local_48,(Type)(node->field_1).wasmType.id,false);
    std::_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~_Vector_base
              (&local_48);
    return (Expression *)pCVar2;
  case Expr:
    if (((node->field_1).expr)->_id == ConstId) {
      pCVar4 = Expression::cast<wasm::Const>((node->field_1).expr);
      Literal::Literal(&local_68,&pCVar4->value);
      pCVar4 = Builder::makeConst(&local_28,&local_68);
      Literal::~Literal(&local_68);
      return (Expression *)pCVar4;
    }
    pLVar5 = getSet(this,node);
    index = pLVar5->index;
    break;
  case Phi:
    index = (node->field_1).index;
    break;
  default:
    handle_unreachable("unexpected node type",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/dataflow/graph.h"
                       ,0x317);
  case Zext:
    pEVar3 = makeUse(this,*(node->values).
                           super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>
                           ._M_impl.super__Vector_impl_data._M_start);
    return pEVar3;
  }
  TVar6 = Function::getLocalType(this->func,index);
  pLVar7 = MixedArena::alloc<wasm::LocalGet>(&pMVar1->allocator);
  pLVar7->index = index;
  (pLVar7->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id = TVar6.id;
  return (Expression *)pLVar7;
}

Assistant:

Expression* makeUse(Node* node) {
    Builder builder(*module);
    if (node->isPhi()) {
      // The index is the wasm local that we assign to when implementing
      // the phi; get from there.
      auto index = node->index;
      return builder.makeLocalGet(index, func->getLocalType(index));
    } else if (node->isConst()) {
      return builder.makeConst(node->expr->cast<Const>()->value);
    } else if (node->isExpr()) {
      // Find the set we are a value of.
      auto index = getSet(node)->index;
      return builder.makeLocalGet(index, func->getLocalType(index));
    } else if (node->isZext()) {
      // i1 zexts are a no-op for wasm
      return makeUse(node->values[0]);
    } else if (node->isVar()) {
      // Nothing valid for us to read here. Emit a call, representing an unknown
      // variable value.
      return Builder(*module).makeCall(FAKE_CALL, {}, node->wasmType);
    } else {
      WASM_UNREACHABLE("unexpected node type"); // TODO
    }
  }